

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_superalphabet_brodnik(uchar **strings,size_t n)

{
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *this;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  this = (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::TrieNode(this);
  insert<32768u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_short>,unsigned_short>
            (this,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_short>
            (this,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_superalphabet_brodnik(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}